

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::ReduceHelper<unsigned_long>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              unsigned_long length,Arguments *args,ScriptContext *scriptContext)

{
  RecyclableObject *pRVar1;
  ThreadContext *this;
  code *pcVar2;
  double value;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  Var pvVar7;
  undefined4 extraout_var;
  undefined4 *puVar8;
  undefined4 extraout_var_00;
  JavascriptMethod p_Var9;
  uint64 uVar10;
  uint64 uVar11;
  char16_t *pcVar12;
  ulong start;
  ulong uVar13;
  undefined1 local_78 [8];
  JsReentLock jsReentLock;
  Var local_48;
  
  local_78 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_78)->noJsReentrancy;
  ((ThreadContext *)local_78)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_78,pArr);
  if (((ulong)args->Info & 0xfffffe) == 0) {
LAB_00b9b857:
    pcVar12 = L"[TypedArray].prototype.reduce";
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      pcVar12 = L"Array.prototype.reduce";
    }
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec34,pcVar12);
  }
  pvVar7 = Arguments::operator[](args,1);
  bVar3 = JavascriptConversion::IsCallable(pvVar7);
  if (!bVar3) goto LAB_00b9b857;
  if (pArr == (JavascriptArray *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) {
    bVar3 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    if (bVar3) {
      typedArrayBase = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    }
    else {
      typedArrayBase = (TypedArrayBase *)0x0;
    }
  }
  pvVar7 = Arguments::operator[](args,1);
  jsReentLock._24_8_ = VarTo<Js::RecyclableObject>(pvVar7);
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    if (length == 0) {
      pcVar12 = L"TypedArray.prototype.reduce";
      if (typedArrayBase == (TypedArrayBase *)0x0) {
        pcVar12 = L"Array.prototype.reduce";
      }
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ea0b,pcVar12);
    }
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      start = 1;
      do {
        *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        BVar5 = JavascriptOperators::HasItem(obj,start - 1);
        JsReentLock::MutateArrayObject((JsReentLock *)local_78);
        *(bool *)((long)local_78 + 0x108) = true;
        if (BVar5 != 0) {
          *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          local_48 = JavascriptOperators::GetItem(obj,start - 1,scriptContext);
          JsReentLock::MutateArrayObject((JsReentLock *)local_78);
          *(bool *)((long)local_78 + 0x108) = true;
          goto LAB_00b9b599;
        }
        bVar3 = start < length;
        start = start + 1;
      } while (bVar3);
      pcVar12 = L"Array.prototype.reduce";
LAB_00b9b556:
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ea0b,pcVar12);
    }
    bVar3 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
    if (!bVar3) {
      bVar3 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
      if (bVar3) {
LAB_00b9b8bf:
        Throw::FatalInternalError(-0x7fffbffb);
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x277b,"(VarIsCorrectType(typedArrayBase))",
                                  "VarIsCorrectType(typedArrayBase)");
      if (bVar3) {
        *puVar8 = 0;
        goto LAB_00b9b8bf;
      }
      goto LAB_00b9b97f;
    }
    if ((typedArrayBase->super_ArrayBufferParent).super_ArrayObject.length == 0) {
      pcVar12 = L"TypedArray.prototype.reduce";
      goto LAB_00b9b556;
    }
    iVar6 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(typedArrayBase,0);
    local_48 = (Var)CONCAT44(extraout_var,iVar6);
    start = 1;
  }
  else {
    local_48 = Arguments::operator[](args,2);
    start = 0;
  }
LAB_00b9b599:
  if (local_48 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x27a2,"(accumulator)","accumulator");
    if (!bVar3) goto LAB_00b9b97f;
    *puVar8 = 0;
  }
  if (typedArrayBase == (TypedArrayBase *)0x0) {
    *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    local_48 = ReduceObjectHelper<unsigned_long>
                         (obj,length,start,(RecyclableObject *)jsReentLock._24_8_,local_48,
                          scriptContext);
  }
  else {
    pRVar1 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
    bVar3 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
    if (!bVar3) {
      bVar3 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x27a8,"(VarIsCorrectType(typedArrayBase))",
                                    "VarIsCorrectType(typedArrayBase)");
        if (!bVar3) {
LAB_00b9b97f:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
      }
      Throw::FatalInternalError(-0x7fffbffb);
    }
    uVar13 = (ulong)(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.length;
    if (uVar13 < length) {
      length = uVar13;
    }
    if (start < length) {
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        iVar6 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x72])(typedArrayBase,start & 0xffffffff);
        *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        this = scriptContext->threadContext;
        bVar3 = this->reentrancySafeOrHandled;
        this->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
        if (scriptContext->threadContext->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)jsReentLock._24_8_);
        CheckIsExecutable((RecyclableObject *)jsReentLock._24_8_,p_Var9);
        p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)jsReentLock._24_8_);
        if (start < 0x80000000) {
          uVar13 = start + 0x1000000000000;
        }
        else {
          value = (double)(long)start;
          uVar10 = NumberUtilities::ToSpecial(value);
          bVar4 = NumberUtilities::IsNan(value);
          if (((bVar4) && (uVar11 = NumberUtilities::ToSpecial(value), uVar11 != 0xfff8000000000000)
              ) && (uVar11 = NumberUtilities::ToSpecial(value), uVar11 != 0x7ff8000000000000)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar4) goto LAB_00b9b97f;
            *puVar8 = 0;
          }
          uVar13 = uVar10 ^ 0xfffc000000000000;
        }
        local_48 = (*p_Var9)((RecyclableObject *)jsReentLock._24_8_,(CallInfo)jsReentLock._24_8_,
                             0x2000005,0,0,0,0,0x2000005,pRVar1,local_48,
                             CONCAT44(extraout_var_00,iVar6),uVar13,typedArrayBase);
        this->reentrancySafeOrHandled = bVar3;
        JsReentLock::MutateArrayObject((JsReentLock *)local_78);
        *(bool *)((long)local_78 + 0x108) = true;
        start = start + 1;
      } while (length != start);
    }
  }
  *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return local_48;
}

Assistant:

Var JavascriptArray::ReduceHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.reduce"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.reduce"));
            }
        }

        // If we came from Array.prototype.reduce and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        T k = 0;
        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var accumulator = nullptr;
        Var element = nullptr;

        if (args.Info.Count > 2)
        {
            accumulator = args[2];
        }
        else
        {
            if (length == 0)
            {
                if (typedArrayBase)
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_EmptyArrayAndInitValueNotPresent, _u("TypedArray.prototype.reduce"));
                }
                else
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_EmptyArrayAndInitValueNotPresent, _u("Array.prototype.reduce"));
                }
            }

            bool bPresent = false;

            if (typedArrayBase)
            {
                AssertAndFailFast(VarIsCorrectType(typedArrayBase));
                uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

                for (; k < end && bPresent == false; k++)
                {
                    // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                    element = typedArrayBase->DirectGetItem((uint32)k);

                    bPresent = true;
                    accumulator = element;
                }
            }
            else
            {
                for (; k < length && bPresent == false; k++)
                {
                    JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, k));
                    if (hasItem)
                    {
                        JS_REENTRANT(jsReentLock, accumulator = JavascriptOperators::GetItem(obj, k, scriptContext));
                        bPresent = true;
                    }
                }
            }

            if (bPresent == false)
            {
                if (typedArrayBase)
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_EmptyArrayAndInitValueNotPresent, _u("TypedArray.prototype.reduce"));
                }
                else
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_EmptyArrayAndInitValueNotPresent, _u("Array.prototype.reduce"));
                }
            }
        }

        Assert(accumulator);

        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();

        if (typedArrayBase)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                element = typedArrayBase->DirectGetItem((uint32)k);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        accumulator = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 5), undefinedValue,
                                accumulator,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::ReduceObjectHelper<T>(obj, length, k, callBackFn, accumulator, scriptContext));
        }

        return accumulator;
    }